

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateCache::ReloadAllIfChanged(TemplateCache *this,ReloadType reload_type)

{
  Template *this_00;
  int iVar1;
  Strip strip;
  _Hash_node_base *p_Var2;
  WriterMutexLock ml;
  WriterMutexLock local_58;
  TemplateString local_50;
  
  local_58.mu_ = this->mutex_;
  if (((pthread_rwlock_t *)((long)local_58.mu_ + 0x38))->__size[0] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_58.mu_);
    if (iVar1 != 0) {
      abort();
    }
  }
  if ((this->is_frozen_ == false) &&
     (p_Var2 = (this->parsed_template_cache_->_M_h)._M_before_begin._M_nxt,
     p_Var2 != (_Hash_node_base *)0x0)) {
    do {
      *(undefined1 *)&p_Var2[4]._M_nxt = 1;
      if (reload_type == IMMEDIATE_RELOAD) {
        this_00 = (Template *)(p_Var2[3]._M_nxt)->_M_nxt;
        local_50.ptr_ = Template::original_filename(this_00);
        if (local_50.ptr_ == (char *)0x0) {
          local_50.ptr_ = "";
        }
        local_50.length_ = strlen(local_50.ptr_);
        local_50.is_immutable_ = false;
        local_50.id_ = 0;
        strip = Template::strip(this_00);
        GetTemplateLocked(this,&local_50,strip,(TemplateCacheKey *)(p_Var2 + 1));
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  WriterMutexLock::~WriterMutexLock(&local_58);
  return;
}

Assistant:

void TemplateCache::ReloadAllIfChanged(ReloadType reload_type) {
  WriterMutexLock ml(mutex_);
  if (is_frozen_) {  // do not reload a frozen cache.
    return;
  }
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end();
       ++it) {
    it->second.should_reload = true;
    if (reload_type == IMMEDIATE_RELOAD) {
      const Template* tpl = it->second.refcounted_tpl->tpl();
      // Reload should always use the original filename.
      // For instance on reload, we may replace an existing template with a
      // new one that came earlier on the search path.
      GetTemplateLocked(tpl->original_filename(), tpl->strip(), it->first);
    }
  }
}